

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * operator*(Matrix *__return_storage_ptr__,Matrix *lhs,Matrix *rhs)

{
  Fraction *pFVar1;
  Fraction *b;
  invalid_argument *this;
  int iVar2;
  int i;
  int iVar3;
  int j;
  Fraction local_38;
  
  if (lhs->m_ == rhs->n_) {
    i = 0;
    Matrix::Matrix(__return_storage_ptr__,lhs->n_,rhs->m_,0);
    iVar2 = __return_storage_ptr__->n_;
    if (0 < iVar2) {
      iVar3 = __return_storage_ptr__->m_;
      do {
        if (0 < iVar3) {
          iVar2 = lhs->m_;
          j = 0;
          do {
            if (0 < iVar2) {
              iVar3 = 0;
              do {
                pFVar1 = Matrix::At(lhs,i,iVar3);
                b = Matrix::At(rhs,iVar3,j);
                local_38 = operator*(pFVar1,b);
                pFVar1 = Matrix::At(__return_storage_ptr__,i,j);
                Fraction::operator+=(pFVar1,&local_38);
                iVar3 = iVar3 + 1;
                iVar2 = lhs->m_;
              } while (iVar3 < iVar2);
              iVar3 = __return_storage_ptr__->m_;
            }
            j = j + 1;
          } while (j < iVar3);
          iVar2 = __return_storage_ptr__->n_;
        }
        i = i + 1;
      } while (i < iVar2);
    }
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"[MUL] Mismatched number of rows");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int Matrix::GetNumColumns() const {
  return m_;
}